

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

int i2d_PKCS12_fp(FILE *fp,PKCS12 *p12)

{
  int iVar1;
  BIO *a;
  
  a = BIO_new_fp(fp,0);
  if (a == (BIO *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = BIO_write_all((BIO *)a,p12->version,(size_t)p12->mac);
    BIO_free(a);
  }
  return iVar1;
}

Assistant:

int i2d_PKCS12_fp(FILE *fp, const PKCS12 *p12) {
  BIO *bio = BIO_new_fp(fp, 0 /* don't take ownership */);
  if (bio == NULL) {
    return 0;
  }

  int ret = i2d_PKCS12_bio(bio, p12);
  BIO_free(bio);
  return ret;
}